

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_logspec_dct2(fe_t *fe,mfcc_t *fr_spec,mfcc_t *fr_cep)

{
  powspec_t *mflogspec;
  long lVar1;
  long lVar2;
  
  mflogspec = (powspec_t *)
              __ckd_malloc__((long)fe->mel_fb->num_filters << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                             ,0x2e3);
  lVar1 = (long)fe->mel_fb->num_filters;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      mflogspec[lVar2] = (powspec_t)(double)(float)fr_spec[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  fe_dct2(fe,mflogspec,fr_cep,0);
  ckd_free(mflogspec);
  return 0;
}

Assistant:

int32
fe_logspec_dct2(fe_t * fe, const mfcc_t * fr_spec, mfcc_t * fr_cep)
{
#ifdef FIXED_POINT
    fe_dct2(fe, fr_spec, fr_cep, 0);
#else                           /* ! FIXED_POINT */
    powspec_t *powspec;
    int32 i;

    powspec = ckd_malloc(fe->mel_fb->num_filters * sizeof(powspec_t));
    for (i = 0; i < fe->mel_fb->num_filters; ++i)
        powspec[i] = (powspec_t) fr_spec[i];
    fe_dct2(fe, powspec, fr_cep, 0);
    ckd_free(powspec);
#endif                          /* ! FIXED_POINT */
    return 0;
}